

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator%(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  uint uVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  float *pfVar5;
  int iVar6;
  pointer pBVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pBVar11;
  long lVar12;
  float fVar13;
  Blade BStack_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar5 = Re;
  iVar6 = dim;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < dim) {
    uVar10 = (ulong)(uint)dim;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pfVar5[uVar9] = 0.0;
  }
  pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pBVar7 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_start; pfVar5 = Re, pBVar7 != pBVar3; pBVar7 = pBVar7 + 1
      ) {
    pBVar4 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    uVar1 = pBVar7->mBase;
    for (pBVar11 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                   super__Vector_impl_data._M_start; pBVar11 != pBVar4; pBVar11 = pBVar11 + 1) {
      fVar13 = pBVar7->mVal * pBVar11->mVal;
      if (1e-06 < ABS(fVar13)) {
        uVar2 = pBVar11->mBase;
        uVar8 = uVar2 & uVar1;
        if ((uVar8 != uVar1) && (uVar8 != 0 && uVar8 != uVar2)) {
          pfVar5[(int)(uVar2 ^ uVar1)] =
               (float)signs[(int)uVar1][(int)uVar2] * fVar13 + pfVar5[(int)(uVar2 ^ uVar1)];
        }
      }
    }
  }
  for (lVar12 = 0; lVar12 < iVar6; lVar12 = lVar12 + 1) {
    fVar13 = Re[lVar12];
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      Blade::Blade(&BStack_38,(int)lVar12,fVar13);
      std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
                (__return_storage_ptr__,&BStack_38);
      Blade::~Blade(&BStack_38);
      iVar6 = dim;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator%(Clifford A, Clifford B)
{
   Clifford R;
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;

    idx a=A.begin();
	while(a!=A.end())
	{
		idx b=B.begin();
		int am=a->mBase;
		while(b!=B.end())
		{
			int bm=b->mBase;
			int q=am&bm;
			float c=(a->mVal)*(b->mVal);
			if((c>Error2||c<(-Error2))&&((q!=am)&&(q!=bm)&&(q!=0)))
			{
				//int sig=sign2(am,bm);
				//Re[am^bm]+=sig*c;
				Re[am^bm]+=signs[am][bm]*c;
			}
			b++;
		}
		a++;
	}
	
   for(int i=0;i<dim;i++)
   {if(Re[i]!=0){R.push_back(Blade(i,Re[i]));}}
  
  //delete Re;
  return R;
}